

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leb128.cc
# Opt level: O3

void wabt::WriteS32Leb128(Stream *stream,uint32_t value,char *desc)

{
  bool bVar1;
  uint uVar2;
  long lVar3;
  uint32_t uVar4;
  uint8_t data [5];
  byte local_5 [5];
  
  if ((int)value < 0) {
    if (((int)value >> 7 == 0xffffffffU & (byte)((value & 0x40) >> 6)) == 0) {
      lVar3 = 0;
      uVar4 = value;
      uVar2 = (int)value >> 7;
      do {
        value = uVar2;
        local_5[lVar3] = (byte)uVar4 | 0x80;
        lVar3 = lVar3 + 1;
        uVar4 = value;
        uVar2 = (int)value >> 7;
      } while ((value & 0x40) == 0 || (int)value >> 7 != 0xffffffff);
      goto LAB_0015ab48;
    }
  }
  else if (0x3f < value) {
    lVar3 = 0;
    uVar4 = value;
    do {
      value = uVar4 >> 7;
      local_5[lVar3] = (byte)uVar4 | 0x80;
      lVar3 = lVar3 + 1;
      bVar1 = 0x1fff < uVar4;
      uVar4 = value;
    } while (bVar1);
    goto LAB_0015ab48;
  }
  lVar3 = 0;
LAB_0015ab48:
  local_5[lVar3] = (byte)value & 0x7f;
  Stream::WriteData(stream,local_5,lVar3 + 1,desc,No);
  return;
}

Assistant:

void WriteS32Leb128(Stream* stream, uint32_t value, const char* desc) {
  WriteS32Leb128(stream, Bitcast<int32_t>(value), desc);
}